

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

void SituationToFen(Situation *situation,char *fen)

{
  byte bVar1;
  char cVar2;
  UINT8 *pUVar3;
  long lVar4;
  char *fent;
  long lVar5;
  int iVar6;
  char *pcVar7;
  
  pUVar3 = situation->current_board + 0x33;
  for (lVar4 = 3; lVar4 != 0xd; lVar4 = lVar4 + 1) {
    iVar6 = 0;
    for (lVar5 = -9; lVar5 != 0; lVar5 = lVar5 + 1) {
      bVar1 = pUVar3[lVar5 + 9];
      if (bVar1 == 0) {
        iVar6 = iVar6 + 1;
      }
      else {
        if (iVar6 != 0) {
          *fen = (char)iVar6 + '0';
          fen = fen + 1;
        }
        pcVar7 = "vector::_M_realloc_insert" + (ulong)bVar1 + 0xb;
        if ((bVar1 & 0x10) != 0) {
          pcVar7 = FEN_OF_PIECE[0] + (bVar1 - 0x10);
        }
        *fen = *pcVar7;
        fen = fen + 1;
        iVar6 = 0;
      }
    }
    if (0 < iVar6) {
      *fen = (char)iVar6 + '0';
      fen = fen + 1;
    }
    *fen = '/';
    fen = fen + 1;
    pUVar3 = pUVar3 + 0x10;
  }
  fen[-1] = ' ';
  cVar2 = 'b';
  if (situation->current_player == 0) {
    cVar2 = 'w';
  }
  *fen = cVar2;
  fen[1] = '\0';
  return;
}

Assistant:

void SituationToFen(Situation & situation, char* fen){
    int row, col, piece_id, space_count;
    char *fent = fen;
    for(row = 3; row <= 12; row++){
        space_count = 0;
        for(col = 3; col <= 11; col ++){
            piece_id = situation.current_board[GetPosition(col, row)];
            if(piece_id != 0){
                if(space_count != 0){
                    *fent = space_count + '0';
                    space_count = 0;
                    fent ++;
                }
                if(piece_id & 16){
                    *fent = FEN_OF_PIECE[0][piece_id - 16];
                }
                else{
                    *fent = FEN_OF_PIECE[1][piece_id - 32];
                }
                fent ++;
            }
            else{
                space_count ++;
            }
        }
        if(space_count > 0){
            *fent = space_count + '0';
            fent ++;
        }
        *fent = '/';
        fent ++;
    }
    *(fent - 1) = ' ';
    *fent = (situation.current_player == RED ? 'w' : 'b');
    fent ++;
    *fent = '\0';
}